

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void impute_missing_values<double,long>
               (double *numeric_data,int *categ_data,bool is_col_major,double *Xr,long *Xr_ind,
               long *Xr_indptr,size_t nrows,bool use_long_double,int nthreads,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  if (use_long_double) {
    impute_missing_values_internal<double,long,long_double>
              (numeric_data,categ_data,is_col_major,Xr,Xr_ind,Xr_indptr,nrows,nthreads,model_outputs
               ,model_outputs_ext,imputer);
  }
  else {
    impute_missing_values_internal<double,long,double>
              (numeric_data,categ_data,is_col_major,Xr,Xr_ind,Xr_indptr,nrows,nthreads,model_outputs
               ,model_outputs_ext,imputer);
  }
  return;
}

Assistant:

void impute_missing_values(real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, bool use_long_double, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    if (use_long_double && !has_long_double()) {
        use_long_double = false;
        print_errmsg("Passed 'use_long_double=true', but library was compiled without long double support.\n");
    }
    #ifndef NO_LONG_DOUBLE
    if (likely(!use_long_double))
    #endif
        impute_missing_values_internal<real_t, sparse_ix, double>(
            numeric_data, categ_data, is_col_major,
            Xr, Xr_ind, Xr_indptr,
            nrows, nthreads,
            model_outputs, model_outputs_ext,
            imputer
        );
    #ifndef NO_LONG_DOUBLE
    else
        impute_missing_values_internal<real_t, sparse_ix, long double>(
            numeric_data, categ_data, is_col_major,
            Xr, Xr_ind, Xr_indptr,
            nrows, nthreads,
            model_outputs, model_outputs_ext,
            imputer
        );
    #endif
}